

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::findDTValidator
          (TraverseSchema *this,DOMElement *elem,XMLCh *derivedTypeName,XMLCh *baseTypeName,
          int baseRefContext)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  XMLStringPool *pXVar4;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar5;
  ulong uVar6;
  SchemaInfo *pSVar7;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  ListType aListType;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DatatypeValidator *pDVar13;
  XMLCh *pXVar14;
  SchemaInfo *toRestore_00;
  DOMElement *childElem;
  XMLCh *pXVar15;
  XMLSize_t XVar16;
  XMLSize_t getAt;
  ulong uVar17;
  ulong uVar18;
  XMLCh *pXVar19;
  XMLCh *pXVar20;
  bool bVar21;
  
  iVar11 = XMLString::indexOf(baseTypeName,L':');
  if (iVar11 + 1U < 2) {
    pXVar19 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,baseTypeName,(long)iVar11);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar12 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar11 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar12);
    pXVar19 = (XMLCh *)CONCAT44(extraout_var,iVar11);
  }
  iVar11 = XMLString::indexOf(baseTypeName,L':');
  XVar16 = 0;
  if (baseTypeName != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)baseTypeName + XVar16);
      XVar16 = XVar16 + 2;
    } while (*psVar1 != 0);
    XVar16 = ((long)XVar16 >> 1) - 1;
  }
  if (XVar16 == (long)(iVar11 + 1)) {
    pXVar20 = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar11 == -1) {
      this_00->fIndex = 0;
      pXVar20 = baseTypeName;
    }
    else {
      XVar16 = XVar16 + ~(long)iVar11;
      this_00->fIndex = 0;
      pXVar20 = baseTypeName + (long)iVar11 + 1;
    }
    XMLBuffer::append(this_00,pXVar20,XVar16);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar12 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar11 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar12);
    pXVar20 = (XMLCh *)CONCAT44(extraout_var_00,iVar11);
  }
  pXVar19 = resolvePrefixToURI(this,elem,pXVar19);
  pDVar13 = getDatatypeValidator(this,pXVar19,pXVar20);
  if (pDVar13 != (DatatypeValidator *)0x0) goto LAB_00339b84;
  if (pXVar19 == L"http://www.w3.org/2001/XMLSchema") {
LAB_00339c5d:
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,pXVar19,pXVar20,
                      (XMLCh *)0x0,(XMLCh *)0x0);
    return (DatatypeValidator *)0x0;
  }
  pXVar14 = L"http://www.w3.org/2001/XMLSchema";
  pXVar15 = pXVar19;
  if (pXVar19 == (XMLCh *)0x0) {
LAB_00339c1a:
    if (*pXVar14 == L'\0') goto LAB_00339c5d;
  }
  else {
    do {
      XVar2 = *pXVar15;
      if (XVar2 == L'\0') goto LAB_00339c1a;
      XVar3 = *pXVar14;
      pXVar14 = pXVar14 + 1;
      pXVar15 = pXVar15 + 1;
    } while (XVar2 == XVar3);
  }
  pXVar14 = this->fTargetNSURIString;
  bVar21 = true;
  if (pXVar19 != pXVar14) {
    pXVar15 = pXVar19;
    if (pXVar14 == (XMLCh *)0x0 || pXVar19 == (XMLCh *)0x0) {
      if (pXVar19 == (XMLCh *)0x0) {
        if (pXVar14 != (XMLCh *)0x0) goto LAB_00339caa;
      }
      else {
        bVar21 = *pXVar19 == L'\0';
        if ((pXVar14 != (XMLCh *)0x0) && (*pXVar19 == L'\0')) {
LAB_00339caa:
          bVar21 = *pXVar14 == L'\0';
        }
      }
    }
    else {
      do {
        XVar2 = *pXVar15;
        if (XVar2 == L'\0') goto LAB_00339caa;
        XVar3 = *pXVar14;
        pXVar14 = pXVar14 + 1;
        pXVar15 = pXVar15 + 1;
      } while (XVar2 == XVar3);
      bVar21 = false;
    }
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  uVar12 = this->fCurrentScope;
  aListType = INCLUDE;
  if (((pXVar19 == (XMLCh *)0x0) || (bVar21)) || (*pXVar19 == L'\0')) {
LAB_00339e3f:
    childElem = SchemaInfo::getTopLevelComponent
                          (*enclosingSchema,1,L"simpleType",pXVar20,enclosingSchema);
    bVar21 = true;
    bVar10 = true;
    if (childElem == (DOMElement *)0x0) goto LAB_00339e9e;
    pDVar13 = traverseSimpleTypeDecl(this,childElem,true,0);
    if (toRestore != this->fSchemaInfo) {
      restoreSchemaInfo(this,toRestore,aListType,uVar12);
    }
  }
  else {
    iVar11 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
    pVVar5 = this->fImportedNSList;
    if (pVVar5 == (ValueVectorOf<int> *)0x0) {
LAB_00339d69:
      bVar21 = false;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,pXVar19,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      aListType = INCLUDE;
    }
    else {
      uVar6 = pVVar5->fCurCount;
      bVar21 = uVar6 != 0;
      if (uVar6 == 0) {
LAB_00339d48:
        if (!bVar21) goto LAB_00339d69;
      }
      else if (*pVVar5->fElemList != iVar11) {
        uVar17 = 0;
        do {
          uVar18 = uVar6;
          if (uVar6 - 1 == uVar17) break;
          uVar18 = uVar17 + 1;
          lVar9 = uVar17 + 1;
          uVar17 = uVar18;
        } while (pVVar5->fElemList[lVar9] != iVar11);
        bVar21 = uVar18 < uVar6;
        goto LAB_00339d48;
      }
      pSVar7 = *enclosingSchema;
      pRVar8 = pSVar7->fImportedInfoList;
      if (pRVar8 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
        XVar16 = 0;
      }
      else {
        XVar16 = (pRVar8->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
      }
      if (XVar16 != 0) {
        getAt = 0;
        do {
          toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                   (&pSVar7->fImportedInfoList->
                                     super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
          if (toRestore_00->fTargetNSURI == iVar11) goto LAB_00339dde;
          getAt = getAt + 1;
        } while (XVar16 != getAt);
      }
      toRestore_00 = (SchemaInfo *)0x0;
LAB_00339dde:
      if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true)) {
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,pXVar19,pXVar20
                          ,(XMLCh *)0x0,(XMLCh *)0x0);
        aListType = INCLUDE;
        bVar21 = false;
      }
      else {
        restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
        aListType = IMPORT;
        bVar21 = true;
      }
    }
    if (bVar21) goto LAB_00339e3f;
    bVar10 = false;
LAB_00339e9e:
    bVar21 = bVar10;
    pDVar13 = (DatatypeValidator *)0x0;
  }
  if (!bVar21) {
    return (DatatypeValidator *)0x0;
  }
LAB_00339b84:
  if (pDVar13 == (DatatypeValidator *)0x0) {
    pXVar19 = L"http://apache.org/xml/messages/XMLValidity";
    iVar11 = 0x1e;
  }
  else {
    if ((pDVar13->fFinalSet & baseRefContext) == 0) {
      return pDVar13;
    }
    pXVar19 = L"http://apache.org/xml/messages/XMLErrors";
    iVar11 = 0x3e;
    derivedTypeName = (XMLCh *)0x0;
  }
  reportSchemaError(this,elem,pXVar19,iVar11,baseTypeName,derivedTypeName,(XMLCh *)0x0,(XMLCh *)0x0)
  ;
  return (DatatypeValidator *)0x0;
}

Assistant:

DatatypeValidator*
TraverseSchema::findDTValidator(const DOMElement* const elem,
                                const XMLCh* const derivedTypeName,
                                const XMLCh* const baseTypeName,
                                const int baseRefContext) {

    const XMLCh*       prefix = getPrefix(baseTypeName);
    const XMLCh*       localPart = getLocalPart(baseTypeName);
    const XMLCh*       uri = resolvePrefixToURI(elem, prefix);
    DatatypeValidator* baseValidator = getDatatypeValidator(uri, localPart);

    if (baseValidator == 0) {

        // Check if the base is from the schema for schema namespace
        //
        if (XMLString::equals(uri, SchemaSymbols::fgURI_SCHEMAFORSCHEMA))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
            return 0;
        }

        SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
        SchemaInfo* saveInfo = fSchemaInfo;
        unsigned int         saveScope = fCurrentScope;

        if (!XMLString::equals(uri, fTargetNSURIString) && (uri && *uri)) {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uri);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uri);
                return 0;
            }

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }

        DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
            SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

        if (baseTypeNode != 0) {

            baseValidator = traverseSimpleTypeDecl(baseTypeNode);

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }
        }
    }

    if (baseValidator == 0) {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::UnknownBaseDatatype, baseTypeName, derivedTypeName);
    }
    else if ((baseValidator->getFinalSet() & baseRefContext) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DisallowedBaseDerivation, baseTypeName);
        return 0;
    }

    return baseValidator;
}